

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O2

void append_float(t_append *x,t_float f)

{
  t_symbol *s;
  t_gstub *ptVar1;
  _glist *owner;
  _scalar *p_Var2;
  int iVar3;
  t_template *x_00;
  t_scalar *x_01;
  _glist *extraout_RAX;
  _glist *p_Var4;
  _gobj **pp_Var5;
  char *pcVar6;
  char *fmt;
  int iVar7;
  t_appendvariable *ptVar8;
  
  s = x->x_templatesym;
  if (s->s_name == (char *)0x0) {
    pcVar6 = "append: no template supplied";
  }
  else {
    iVar3 = x->x_nin;
    ptVar1 = (x->x_gp).gp_stub;
    x_00 = template_findbyname(s);
    if (x_00 == (t_template *)0x0) {
      pcVar6 = s->s_name;
      fmt = "append: couldn\'t find template %s";
LAB_0015f33c:
      pd_error(x,fmt,pcVar6);
      return;
    }
    if (ptVar1 == (t_gstub *)0x0) {
      pcVar6 = "append: no current pointer";
    }
    else if (ptVar1->gs_which == 1) {
      owner = (ptVar1->gs_un).gs_glist;
      if (owner->gl_valid == (x->x_gp).gp_valid) {
        if (iVar3 == 0) {
          return;
        }
        x->x_variables->gv_f = f;
        x_01 = scalar_new(owner,s);
        if (x_01 != (t_scalar *)0x0) {
          p_Var2 = (x->x_gp).gp_un.gp_scalar;
          pp_Var5 = &(p_Var2->sc_gobj).g_next;
          if (p_Var2 == (_scalar *)0x0) {
            pp_Var5 = &owner->gl_list;
          }
          p_Var4 = (_glist *)*pp_Var5;
          (x_01->sc_gobj).g_next = (_gobj *)p_Var4;
          *pp_Var5 = &x_01->sc_gobj;
          (x->x_gp).gp_un.gp_scalar = x_01;
          ptVar8 = x->x_variables;
          iVar7 = 0;
          if (0 < iVar3) {
            iVar7 = iVar3;
          }
          while (iVar7 != 0) {
            template_setfloat(x_00,ptVar8->gv_sym,x_01->sc_vec,ptVar8->gv_f,1);
            ptVar8 = ptVar8 + 1;
            p_Var4 = extraout_RAX;
            iVar7 = iVar7 + -1;
          }
          p_Var4 = glist_getcanvas(p_Var4);
          iVar3 = glist_isvisible(p_Var4);
          if (iVar3 != 0) {
            gobj_vis(&x_01->sc_gobj,owner,1);
          }
          outlet_pointer((x->x_obj).te_outlet,&x->x_gp);
          return;
        }
        pcVar6 = s->s_name;
        fmt = "%s: couldn\'t create scalar";
        goto LAB_0015f33c;
      }
      pcVar6 = "append: stale pointer";
    }
    else {
      pcVar6 = "append: lists only, not arrays";
    }
  }
  pd_error(x,pcVar6);
  return;
}

Assistant:

static void append_float(t_append *x, t_float f)
{
    int nitems = x->x_nin, i;
    t_symbol *templatesym = x->x_templatesym;
    t_template *template;
    t_appendvariable *vp;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    t_scalar *sc, *oldsc;
    t_glist *glist;

    if (!templatesym->s_name)
    {
        pd_error(x, "append: no template supplied");
        return;
    }
    template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(x, "append: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!gs)
    {
        pd_error(x, "append: no current pointer");
        return;
    }
    if (gs->gs_which != GP_GLIST)
    {
        pd_error(x, "append: lists only, not arrays");
        return;
    }
    glist = gs->gs_un.gs_glist;
    if (glist->gl_valid != gp->gp_valid)
    {
        pd_error(x, "append: stale pointer");
        return;
    }
    if (!nitems) return;
    x->x_variables[0].gv_f = f;

    sc = scalar_new(glist, templatesym);
    if (!sc)
    {
        pd_error(x, "%s: couldn't create scalar", templatesym->s_name);
        return;
    }
    oldsc = gp->gp_un.gp_scalar;

    if (oldsc)
    {
        sc->sc_gobj.g_next = oldsc->sc_gobj.g_next;
        oldsc->sc_gobj.g_next = &sc->sc_gobj;
    }
    else
    {
        sc->sc_gobj.g_next = glist->gl_list;
        glist->gl_list = &sc->sc_gobj;
    }

    gp->gp_un.gp_scalar = sc;
    vec = sc->sc_vec;
    for (i = 0, vp = x->x_variables; i < nitems; i++, vp++)
    {
        template_setfloat(template, vp->gv_sym, vec, vp->gv_f, 1);
    }

    if (glist_isvisible(glist_getcanvas(glist)))
        gobj_vis(&sc->sc_gobj, glist, 1);
    /*  scalar_redraw(sc, glist);  ... have to do 'vis' instead here because
    redraw assumes we're already visible??? ... */

    outlet_pointer(x->x_obj.ob_outlet, gp);
}